

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O2

void __thiscall
glcts::TextureBufferOperationsViaTransformFeedback::deinit
          (TextureBufferOperationsViaTransformFeedback *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TextureBufferOperations).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x48))(0x8c8e,0,0);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  (**(code **)(lVar2 + 0xd8))(0);
  if (this->m_position_location != -1) {
    (**(code **)(lVar2 + 0x518))();
    this->m_position_location = -1;
  }
  (**(code **)(lVar2 + 0x1680))(0);
  if (this->m_tf_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_tf_po_id = 0;
  }
  if (this->m_tf_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_tf_vs_id = 0;
  }
  if (this->m_tf_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_tf_fs_id = 0;
  }
  if (this->m_tf_vbo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_tf_vbo_id);
    this->m_tf_vbo_id = 0;
  }
  if (this->m_tf_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_tf_vao_id);
    this->m_tf_vao_id = 0;
  }
  TextureBufferOperations::deinit(&this->super_TextureBufferOperations);
  return;
}

Assistant:

void TextureBufferOperationsViaTransformFeedback::deinit(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindVertexArray(0);

	if (m_position_location != -1)
	{
		gl.disableVertexAttribArray(m_position_location);
		m_position_location = -1;
	}

	gl.useProgram(0);

	/* Delete GLES objects */
	if (0 != m_tf_po_id)
	{
		gl.deleteProgram(m_tf_po_id);
		m_tf_po_id = 0;
	}

	if (0 != m_tf_vs_id)
	{
		gl.deleteShader(m_tf_vs_id);
		m_tf_vs_id = 0;
	}

	if (0 != m_tf_fs_id)
	{
		gl.deleteShader(m_tf_fs_id);
		m_tf_fs_id = 0;
	}

	if (0 != m_tf_vbo_id)
	{
		gl.deleteBuffers(1, &m_tf_vbo_id);
		m_tf_vbo_id = 0;
	}

	if (0 != m_tf_vao_id)
	{
		gl.deleteVertexArrays(1, &m_tf_vao_id);
		m_tf_vao_id = 0;
	}

	/* Deinitialize base class */
	TextureBufferOperations::deinit();
}